

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_size.c
# Opt level: O0

int ks_getc(kstream_t *ks)

{
  int iVar1;
  kstream_t *ks_local;
  
  if ((ks->is_eof == 0) || (ks->begin < ks->end)) {
    if (ks->end <= ks->begin) {
      ks->begin = 0;
      iVar1 = gzread(ks->f,ks->buf,0xffff);
      ks->end = iVar1;
      if (ks->end == 0) {
        ks->is_eof = 1;
        return -1;
      }
    }
    iVar1 = ks->begin;
    ks->begin = iVar1 + 1;
    ks_local._4_4_ = (uint)ks->buf[iVar1];
  }
  else {
    ks_local._4_4_ = 0xffffffff;
  }
  return ks_local._4_4_;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_size(char *input_file, int min, int max,int length, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int hit = 0;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

    if (verbose_flag) {
        if (is_fasta)
            fprintf(stderr, "Input is FASTA format\n");
        else
            fprintf(stderr, "Input is FASTQ format\n");
    }

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		hit = size_filter(seq, is_fasta, min, max, length, convert, just_count);
		if (hit)
			count++;
		else
			excluded++;
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}